

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O3

void mi_page_queue_push(mi_heap_t *heap,mi_page_queue_t *queue,mi_page_t *page)

{
  mi_page_s *pmVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  mi_page_queue_t *pmVar9;
  mi_page_s **ppmVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  (page->flags).full_aligned = (page->flags).full_aligned & 0xfe | queue->block_size == 0x10010;
  pmVar1 = queue->first;
  page->next = pmVar1;
  page->prev = (mi_page_s *)0x0;
  ppmVar10 = &pmVar1->prev;
  if (pmVar1 == (mi_page_s *)0x0) {
    ppmVar10 = &queue->last;
  }
  *ppmVar10 = page;
  queue->first = page;
  auVar4 = _DAT_004bff80;
  auVar3 = _DAT_0047c1a0;
  uVar11 = queue->block_size;
  if ((uVar11 < 0x401) &&
     (*(mi_page_t **)((long)heap->pages_free_direct + (uVar11 + 7 & 0xfffffffffffffff8)) != page)) {
    uVar5 = uVar11 + 7 >> 3;
    if (uVar11 < 9) {
      uVar11 = 0;
    }
    else {
      if (uVar11 < 0x41) {
        uVar11 = (ulong)((int)uVar5 + 1U & 0x1e);
      }
      else {
        uVar11 = uVar5 - 1;
        uVar8 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar11 = ((ulong)((uint)(uVar11 >> (0x3dU - (char)(uVar8 ^ 0x3f) & 0x3f)) & 3) +
                  ((uVar8 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
      }
      pmVar9 = queue + -1;
      do {
        uVar8 = pmVar9->block_size + 7;
        uVar12 = uVar8 >> 3;
        if (uVar8 < 0x48) {
          uVar7 = (ulong)((int)uVar12 + 1U & 0x1e);
          if (uVar8 < 0x10) {
            uVar7 = 1;
          }
        }
        else if (uVar8 < 0x10008) {
          uVar8 = uVar12 - 1;
          uVar7 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar7 = ((ulong)((uint)(uVar8 >> (0x3dU - (char)(uVar7 ^ 0x3f) & 0x3f)) & 3) +
                   ((uVar7 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
        }
        else {
          uVar7 = 0x49;
        }
      } while ((uVar11 == uVar7) && (bVar2 = heap->pages < pmVar9, pmVar9 = pmVar9 + -1, bVar2));
      uVar11 = uVar12 + 1;
      if (uVar5 <= uVar12) {
        uVar11 = uVar5;
      }
      if (uVar5 < uVar11) goto LAB_00472e77;
    }
    lVar6 = uVar5 - uVar11;
    auVar13._8_4_ = (int)lVar6;
    auVar13._0_8_ = lVar6;
    auVar13._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar5 = 0;
    auVar13 = auVar13 ^ _DAT_0047c1a0;
    do {
      auVar14._8_4_ = (int)uVar5;
      auVar14._0_8_ = uVar5;
      auVar14._12_4_ = (int)(uVar5 >> 0x20);
      auVar14 = (auVar14 | auVar4) ^ auVar3;
      if ((bool)(~(auVar14._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar14._0_4_ ||
                  auVar13._4_4_ < auVar14._4_4_) & 1)) {
        heap->pages_free_direct[uVar11 + uVar5] = page;
      }
      if ((auVar14._12_4_ != auVar13._12_4_ || auVar14._8_4_ <= auVar13._8_4_) &&
          auVar14._12_4_ <= auVar13._12_4_) {
        heap->pages_free_direct[uVar11 + uVar5 + 1] = page;
      }
      uVar5 = uVar5 + 2;
    } while ((lVar6 + 2U & 0xfffffffffffffffe) != uVar5);
  }
LAB_00472e77:
  heap->page_count = heap->page_count + 1;
  return;
}

Assistant:

static void mi_page_queue_push(mi_heap_t* heap, mi_page_queue_t* queue, mi_page_t* page) {
  mi_assert_internal(mi_page_heap(page) == heap);
  mi_assert_internal(!mi_page_queue_contains(queue, page));
  #if MI_HUGE_PAGE_ABANDON
  mi_assert_internal(_mi_page_segment(page)->kind != MI_SEGMENT_HUGE);
  #endif
  mi_assert_internal(mi_page_block_size(page) == queue->block_size ||
                      (mi_page_is_large_or_huge(page) && mi_page_queue_is_huge(queue)) ||
                        (mi_page_is_in_full(page) && mi_page_queue_is_full(queue)));

  mi_page_set_in_full(page, mi_page_queue_is_full(queue));
  // mi_atomic_store_ptr_release(mi_atomic_cast(void*, &page->heap), heap);
  page->next = queue->first;
  page->prev = NULL;
  if (queue->first != NULL) {
    mi_assert_internal(queue->first->prev == NULL);
    queue->first->prev = page;
    queue->first = page;
  }
  else {
    queue->first = queue->last = page;
  }

  // update direct
  mi_heap_queue_first_update(heap, queue);
  heap->page_count++;
}